

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp-bare.c
# Opt level: O0

void ssh2_bare_bpp_handle_input(BinaryPacketProtocol *bpp)

{
  long lVar1;
  PacketLogSettings *pls;
  LogContext *ctx;
  _Bool _Var2;
  uint32_t u;
  int iVar3;
  int n_blanks;
  void *pvVar4;
  char *texttype;
  ptrlen pVar5;
  undefined1 local_78 [4];
  int nblanks;
  logblank_t blanks [4];
  undefined1 local_2c [4];
  _Bool success_1;
  _Bool success;
  IdempotentCallback *pIStack_28;
  uchar lenbuf [4];
  int *crLine;
  ssh2_bare_bpp_state *s;
  BinaryPacketProtocol *bpp_local;
  
  pIStack_28 = &bpp[-1].ic_in_raw;
  iVar3 = *(int *)&pIStack_28->fn;
  if (iVar3 == 0) goto LAB_00128cd9;
  if (iVar3 == 0x4f) goto LAB_00128ce7;
  if (iVar3 != 0x66) {
    *(undefined4 *)&pIStack_28->fn = 0;
    return;
  }
  while( true ) {
    _Var2 = bufchain_try_fetch_consume
                      (bpp->in_raw,bpp[-1].ic_out_pq.fn,(size_t)bpp[-1].ic_in_raw.ctx);
    if ((!_Var2) && ((bpp->input_eof & 1U) == 0)) {
      return;
    }
    if (!_Var2) break;
    ssh_check_frozen(bpp->ssh);
    **(uint **)&bpp[-1].remote_bugs = (uint)(byte)*bpp[-1].ic_out_pq.fn;
    bpp[-1].ic_out_pq.fn = bpp[-1].ic_out_pq.fn + 1;
    bpp[-1].ic_in_raw.ctx = (void *)((long)bpp[-1].ic_in_raw.ctx + -1);
    lVar1 = *(long *)&bpp[-1].remote_bugs;
    pVar5 = make_ptrlen(bpp[-1].ic_out_pq.fn,(size_t)bpp[-1].ic_in_raw.ctx);
    BinarySource_INIT__((BinarySource *)(lVar1 + 0x30),pVar5);
    if (**(int **)&bpp[-1].remote_bugs == 7) {
      ssh_proto_error(bpp->ssh,"Remote side sent SSH2_MSG_EXT_INFO in bare connection protocol");
      return;
    }
    if (bpp->logctx != (LogContext *)0x0) {
      pls = bpp->pls;
      iVar3 = **(int **)&bpp[-1].remote_bugs;
      pVar5 = make_ptrlen(bpp[-1].ic_out_pq.fn,(size_t)bpp[-1].ic_in_raw.ctx);
      n_blanks = ssh2_censor_packet(pls,iVar3,false,pVar5,(logblank_t *)local_78);
      ctx = bpp->logctx;
      iVar3 = **(int **)&bpp[-1].remote_bugs;
      texttype = ssh2_pkt_type(bpp->pls->kctx,bpp->pls->actx,**(int **)&bpp[-1].remote_bugs);
      log_packet(ctx,0,iVar3,texttype,
                 (void *)(*(long *)(*(long *)&bpp[-1].remote_bugs + 0x30) +
                         *(long *)(*(long *)&bpp[-1].remote_bugs + 0x38)),
                 *(long *)(*(long *)&bpp[-1].remote_bugs + 0x40) -
                 *(long *)(*(long *)&bpp[-1].remote_bugs + 0x38),n_blanks,(logblank_t *)local_78,
                 (unsigned_long *)(*(long *)&bpp[-1].remote_bugs + 8),0,(char *)0x0);
    }
    _Var2 = ssh2_bpp_check_unimplemented(bpp,*(PktIn **)&bpp[-1].remote_bugs);
    if (_Var2) {
      safefree(*(void **)&bpp[-1].remote_bugs);
      bpp[-1].remote_bugs = 0;
      bpp[-1].ext_info_rsa_sha256_ok = false;
      bpp[-1].ext_info_rsa_sha512_ok = false;
      bpp[-1].expect_close = false;
      bpp[-1].field_0xdf = 0;
    }
    else {
      *(long *)(*(long *)&bpp[-1].remote_bugs + 0x20) =
           *(long *)(*(long *)&bpp[-1].remote_bugs + 0x40) -
           *(long *)(*(long *)&bpp[-1].remote_bugs + 0x38);
      pq_base_push(&(bpp->in_pq).pqb,(PacketQueueNode *)(*(long *)&bpp[-1].remote_bugs + 0x10));
      bpp[-1].remote_bugs = 0;
      bpp[-1].ext_info_rsa_sha256_ok = false;
      bpp[-1].ext_info_rsa_sha512_ok = false;
      bpp[-1].expect_close = false;
      bpp[-1].field_0xdf = 0;
    }
LAB_00128cd9:
    *(undefined4 *)&pIStack_28->fn = 0x4f;
LAB_00128ce7:
    _Var2 = bufchain_try_fetch_consume(bpp->in_raw,local_2c,4);
    if ((!_Var2) && ((bpp->input_eof & 1U) == 0)) {
      return;
    }
    if (!_Var2) break;
    ssh_check_frozen(bpp->ssh);
    u = GET_32BIT_MSB_FIRST(local_2c);
    iVar3 = toint(u);
    bpp[-1].ic_in_raw.ctx = (void *)(long)iVar3;
    if (((long)bpp[-1].ic_in_raw.ctx < 1) || (0x8fff < (long)bpp[-1].ic_in_raw.ctx)) {
      ssh_sw_abort(bpp->ssh,"Invalid packet length received");
      *(undefined4 *)&pIStack_28->fn = 0;
      return;
    }
    pvVar4 = safemalloc(1,0x58,(size_t)bpp[-1].ic_in_raw.ctx);
    *(void **)&bpp[-1].remote_bugs = pvVar4;
    *(undefined8 *)(*(long *)&bpp[-1].remote_bugs + 0x10) = 0;
    *(undefined8 *)(*(long *)&bpp[-1].remote_bugs + 0x18) = 0;
    *(undefined1 *)(*(long *)&bpp[-1].remote_bugs + 0x28) = 0;
    *(undefined8 *)&bpp[-1].ic_in_raw.queued = 0;
    bpp[-1].ic_out_pq.fn = (toplevel_callback_fn_t)(*(long *)&bpp[-1].remote_bugs + 0x58);
    pvVar4 = bpp[-1].ic_out_pq.ctx;
    bpp[-1].ic_out_pq.ctx = (void *)((long)pvVar4 + 1);
    *(void **)(*(long *)&bpp[-1].remote_bugs + 8) = pvVar4;
    *(undefined4 *)&pIStack_28->fn = 0x66;
  }
  if ((bpp->expect_close & 1U) == 0) {
    ssh_remote_error(bpp->ssh,"Remote side unexpectedly closed network connection");
    return;
  }
  ssh_remote_eof(bpp->ssh,"Remote side closed network connection");
  return;
}

Assistant:

static void ssh2_bare_bpp_handle_input(BinaryPacketProtocol *bpp)
{
    struct ssh2_bare_bpp_state *s =
        container_of(bpp, struct ssh2_bare_bpp_state, bpp);

    crBegin(s->crState);

    while (1) {
        /* Read the length field. */
        {
            unsigned char lenbuf[4];
            BPP_READ(lenbuf, 4);
            s->packetlen = toint(GET_32BIT_MSB_FIRST(lenbuf));
        }

        if (s->packetlen <= 0 || s->packetlen >= (long)OUR_V2_PACKETLIMIT) {
            ssh_sw_abort(s->bpp.ssh, "Invalid packet length received");
            crStopV;
        }

        /*
         * Allocate the packet to return, now we know its length.
         */
        s->pktin = snew_plus(PktIn, s->packetlen);
        s->pktin->qnode.prev = s->pktin->qnode.next = NULL;
        s->pktin->qnode.on_free_queue = false;
        s->maxlen = 0;
        s->data = snew_plus_get_aux(s->pktin);

        s->pktin->sequence = s->incoming_sequence++;

        /*
         * Read the remainder of the packet.
         */
        BPP_READ(s->data, s->packetlen);

        /*
         * The data we just read is precisely the initial type byte
         * followed by the packet payload.
         */
        s->pktin->type = s->data[0];
        s->data++;
        s->packetlen--;
        BinarySource_INIT(s->pktin, s->data, s->packetlen);

        if (s->pktin->type == SSH2_MSG_EXT_INFO) {
            /*
             * Mild layer violation: EXT_INFO is not permitted in the
             * bare ssh-connection protocol. Faulting it here means
             * that ssh2_common_filter_queue doesn't receive it in the
             * first place unless it's legal to have sent it.
             */
            ssh_proto_error(s->bpp.ssh, "Remote side sent SSH2_MSG_EXT_INFO "
                            "in bare connection protocol");
            return;
        }

        /*
         * Log incoming packet, possibly omitting sensitive fields.
         */
        if (s->bpp.logctx) {
            logblank_t blanks[MAX_BLANKS];
            int nblanks = ssh2_censor_packet(
                s->bpp.pls, s->pktin->type, false,
                make_ptrlen(s->data, s->packetlen), blanks);
            log_packet(s->bpp.logctx, PKT_INCOMING, s->pktin->type,
                       ssh2_pkt_type(s->bpp.pls->kctx, s->bpp.pls->actx,
                                     s->pktin->type),
                       get_ptr(s->pktin), get_avail(s->pktin), nblanks, blanks,
                       &s->pktin->sequence, 0, NULL);
        }

        if (ssh2_bpp_check_unimplemented(&s->bpp, s->pktin)) {
            sfree(s->pktin);
            s->pktin = NULL;
            continue;
        }

        s->pktin->qnode.formal_size = get_avail(s->pktin);
        pq_push(&s->bpp.in_pq, s->pktin);
        s->pktin = NULL;
    }

  eof:
    if (!s->bpp.expect_close) {
        ssh_remote_error(s->bpp.ssh,
                         "Remote side unexpectedly closed network connection");
    } else {
        ssh_remote_eof(s->bpp.ssh, "Remote side closed network connection");
    }
    return;  /* avoid touching s now it's been freed */

    crFinishV;
}